

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# internal.cpp
# Opt level: O0

bool __thiscall LiteScript::Class::operator!=(Class *this,Class *c)

{
  bool bVar1;
  size_type sVar2;
  const_reference pvVar3;
  Object *pOVar4;
  Type *this_00;
  Class *pCVar5;
  uint local_24;
  uint sz;
  uint i;
  Class *c_local;
  Class *this_local;
  
  local_24 = 0;
  sVar2 = std::vector<LiteScript::Variable,_std::allocator<LiteScript::Variable>_>::size
                    (&this->inherit);
  do {
    if ((uint)sVar2 <= local_24) {
      return true;
    }
    pvVar3 = std::vector<LiteScript::Variable,_std::allocator<LiteScript::Variable>_>::operator[]
                       (&this->inherit,(ulong)local_24);
    pOVar4 = Variable::operator->(pvVar3);
    this_00 = Object::GetType(pOVar4);
    bVar1 = Type::operator==(this_00,(Type *)_type_class);
    if (bVar1) {
      pvVar3 = std::vector<LiteScript::Variable,_std::allocator<LiteScript::Variable>_>::operator[]
                         (&this->inherit,(ulong)local_24);
      pOVar4 = Variable::operator->(pvVar3);
      pCVar5 = Object::GetData<LiteScript::Class>(pOVar4);
      if (this == pCVar5) {
        return false;
      }
    }
    local_24 = local_24 + 1;
  } while( true );
}

Assistant:

bool LiteScript::Class::operator!=(const Class &c) const {
    for (unsigned int i = 0, sz = this->inherit.size(); i < sz; i++) {
        if (this->inherit[i]->GetType() == Type::CLASS && this == &this->inherit[i]->GetData<Class>())
            return false;
    }
    return true;
}